

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

quintptr __thiscall QDockAreaLayoutInfo::currentTabId(QDockAreaLayoutInfo *this)

{
  bool bVar1;
  int index;
  QMetaType QVar2;
  anon_union_24_3_e3d07ef4_for_data *__return_storage_ptr__;
  long in_FS_OFFSET;
  QMetaType local_48;
  QMetaType local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  byte local_20;
  undefined7 uStack_1f;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->tabbed == true) && (this->tabBar != (QTabBar *)0x0)) &&
     (index = QTabBar::currentIndex(this->tabBar), index != -1)) {
    __return_storage_ptr__ = &local_38;
    QTabBar::tabData((QVariant *)__return_storage_ptr__,this->tabBar,index);
    local_40.d_ptr =
         (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType;
    local_48.d_ptr = (QMetaTypeInterface *)(CONCAT71(uStack_1f,local_20) & 0xfffffffffffffffc);
    bVar1 = comparesEqual(&local_48,&local_40);
    if (bVar1) {
      if ((local_20 & 1) != 0) {
        local_38.shared =
             (PrivateShared *)
             *(QMetaTypeInterface **)(local_38.shared + (int)*(uint *)(local_38.shared + 4));
      }
    }
    else {
      local_48.d_ptr = (QMetaTypeInterface *)0x0;
      QVar2.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((local_20 & 1) != 0) {
        __return_storage_ptr__ =
             (anon_union_24_3_e3d07ef4_for_data *)
             (local_38.shared + (int)*(uint *)(local_38.shared + 4));
      }
      QMetaType::convert(QVar2,__return_storage_ptr__,local_40,&local_48);
      local_38.shared = (PrivateShared *)local_48.d_ptr;
    }
    ::QVariant::~QVariant((QVariant *)&local_38);
  }
  else {
    local_38.shared = (PrivateShared *)(QMetaTypeInterface *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return (quintptr)(QMetaTypeInterface *)local_38.shared;
}

Assistant:

quintptr QDockAreaLayoutInfo::currentTabId() const
{
    if (!tabbed || tabBar == nullptr)
        return 0;

    int index = tabBar->currentIndex();
    if (index == -1)
        return 0;

    return qvariant_cast<quintptr>(tabBar->tabData(index));
}